

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O2

void __thiscall Fl_Browser_::sort(Fl_Browser_ *this,int flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  bool bVar10;
  long lVar7;
  long lVar9;
  undefined4 extraout_var_01;
  
  iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  if (lVar7 != 0) {
    iVar2 = -1;
    while (lVar7 != 0) {
      iVar3 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,lVar7);
      iVar2 = iVar2 + 1;
      lVar7 = CONCAT44(extraout_var_00,iVar3);
    }
    do {
      if (iVar2 < 1) {
        return;
      }
      iVar3 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
      uVar8 = CONCAT44(extraout_var_01,iVar3);
      iVar3 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,uVar8);
      bVar1 = false;
      lVar7 = CONCAT44(extraout_var_02,iVar3);
      iVar3 = iVar2;
      while (bVar10 = iVar3 != 0, iVar3 = iVar3 + -1, bVar10) {
        iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x12])(this,uVar8);
        iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x12])(this,lVar7);
        iVar6 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,lVar7);
        lVar9 = CONCAT44(extraout_var_05,iVar6);
        iVar4 = strcmp((char *)CONCAT44(extraout_var_03,iVar4),
                       (char *)CONCAT44(extraout_var_04,iVar5));
        if ((flags & 1U) == 0) {
          if (0 < iVar4) {
LAB_001a85d6:
            (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x13])(this,uVar8,lVar7);
            bVar1 = true;
          }
        }
        else if (iVar4 < 0) goto LAB_001a85d6;
        if (lVar9 == 0) break;
        iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,lVar9);
        uVar8 = CONCAT44(extraout_var_06,iVar4);
        lVar7 = lVar9;
      }
      iVar2 = iVar2 + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void Fl_Browser_::sort(int flags) {
  //
  // Simple bubble sort - pure lazyness on my side.
  //
  int i, j, n = -1, desc = ((flags&FL_SORT_DESCENDING)==FL_SORT_DESCENDING);
  void *a =item_first(), *b, *c;
  if (!a) return;
  while (a) {
    a = item_next(a);
    n++;
  }
  for (i=n; i>0; i--) {
    char swapped = 0;
    a = item_first();
    b = item_next(a);
    for (j=0; j<i; j++) {
      const char *ta = item_text(a);
      const char *tb = item_text(b);
      c = item_next(b);
      if (desc) {
        if (strcmp(ta, tb)<0) {
          item_swap(a, b);
          swapped = 1;
        }
      } else {
        if (strcmp(ta, tb)>0) {
          item_swap(a, b);
          swapped = 1;
        }
      }
      if (!c) break;
      b = c; a = item_prev(b);
    }
    if (!swapped)
      break;
  }
}